

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_CoordSys.cpp
# Opt level: O2

istream * amrex::operator>>(istream *is,CoordSys *c)

{
  double dVar1;
  int k;
  istream *this;
  double *pdVar2;
  long lVar3;
  int tmp;
  int coord;
  Real cellsize [3];
  
  this = (istream *)std::istream::ignore((long)is,100000);
  std::istream::operator>>(this,&coord);
  c->c_sys = coord;
  pdVar2 = (double *)std::istream::ignore((long)is,100000);
  std::istream::_M_extract<double>(pdVar2);
  pdVar2 = (double *)std::istream::ignore((long)is,100000);
  std::istream::_M_extract<double>(pdVar2);
  pdVar2 = (double *)std::istream::ignore((long)is,100000);
  std::istream::_M_extract<double>(pdVar2);
  std::istream::ignore((long)is,100000);
  pdVar2 = (double *)std::istream::ignore((long)is,100000);
  std::istream::_M_extract<double>(pdVar2);
  pdVar2 = (double *)std::istream::ignore((long)is,100000);
  std::istream::_M_extract<double>(pdVar2);
  pdVar2 = (double *)std::istream::ignore((long)is,100000);
  std::istream::_M_extract<double>(pdVar2);
  std::istream::ignore((long)is,100000);
  std::istream::operator>>((istream *)is,&tmp);
  c->ok = tmp != 0;
  std::istream::ignore((long)is,100000);
  for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
    dVar1 = cellsize[lVar3];
    c->dx[lVar3] = dVar1;
    c->inv_dx[lVar3] = 1.0 / dVar1;
  }
  return is;
}

Assistant:

std::istream&
operator>> (std::istream& is,
            CoordSys&     c)
{
    int coord;
    is.ignore(BL_IGNORE_MAX, '(') >> coord;
    c.c_sys = (CoordSys::CoordType) coord;
    AMREX_D_EXPR(is.ignore(BL_IGNORE_MAX, '(') >> c.offset[0],
                 is.ignore(BL_IGNORE_MAX, ',') >> c.offset[1],
                 is.ignore(BL_IGNORE_MAX, ',') >> c.offset[2]);
    is.ignore(BL_IGNORE_MAX, ')');
    Real cellsize[3];
    AMREX_D_EXPR(is.ignore(BL_IGNORE_MAX, '(') >> cellsize[0],
                 is.ignore(BL_IGNORE_MAX, ',') >> cellsize[1],
                 is.ignore(BL_IGNORE_MAX, ',') >> cellsize[2]);
    is.ignore(BL_IGNORE_MAX, ')');
    int tmp;
    is >> tmp;
    c.ok = tmp?true:false;
    is.ignore(BL_IGNORE_MAX, '\n');
    for (int k = 0; k < AMREX_SPACEDIM; k++)
    {
        c.dx[k] = cellsize[k];
        c.inv_dx[k] = 1.0_rt/cellsize[k];
    }
    return is;
}